

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

idx_t __thiscall
duckdb::IntervalToStringCast::Format(IntervalToStringCast *this,interval_t interval,char *buffer)

{
  char *pcVar1;
  int value;
  int iVar2;
  int32_t iVar3;
  unsigned_long uVar4;
  long lVar5;
  char *buffer_00;
  idx_t iVar6;
  idx_t iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  idx_t local_38;
  
  buffer_00 = (char *)interval.micros;
  uVar9 = interval._0_8_;
  local_38 = 0;
  iVar2 = (int)this;
  if (iVar2 != 0) {
    value = (int)((long)((ulong)(uint)(iVar2 >> 0x1f) << 0x20 | (ulong)this & 0xffffffff) / 0xc);
    FormatIntervalValue(value,buffer_00,&local_38," year",5);
    FormatIntervalValue(value * -0xc + iVar2,buffer_00,&local_38," month",6);
  }
  if ((ulong)this >> 0x20 != 0) {
    FormatIntervalValue((int32_t)((ulong)this >> 0x20),buffer_00,&local_38," day",4);
  }
  if (uVar9 == 0) {
    if (local_38 == 0) {
      builtin_strncpy(buffer_00,"00:00:00",8);
      local_38 = 8;
    }
  }
  else {
    if (local_38 == 0) {
      iVar6 = 0;
    }
    else {
      iVar6 = local_38 + 1;
      buffer_00[local_38] = ' ';
      local_38 = iVar6;
    }
    if ((long)uVar9 < 0) {
      iVar7 = iVar6 + 1;
      buffer_00[iVar6] = '-';
      local_38 = iVar7;
    }
    else {
      uVar9 = -uVar9;
      iVar7 = iVar6;
    }
    lVar5 = (-uVar9 / 3600000000) * 3600000000 + uVar9;
    lVar10 = lVar5 % -60000000;
    lVar8 = (lVar10 / -1000000) * -1000000;
    if (0xfffffff79e3b9800 < uVar9) {
      local_38 = iVar7 + 1;
      buffer_00[iVar7] = '0';
    }
    FormatSignedNumber(-uVar9 / 3600000000,buffer_00,&local_38);
    pcVar1 = buffer_00 + local_38;
    *pcVar1 = ':';
    local_38 = local_38 + 1;
    TimeToStringCast::FormatTwoDigits(pcVar1 + 1,(int32_t)(lVar5 / -60000000));
    lVar5 = local_38 + 3;
    buffer_00[local_38 + 2] = ':';
    local_38 = local_38 + 3;
    TimeToStringCast::FormatTwoDigits(buffer_00 + lVar5,(int32_t)(lVar10 / -1000000));
    if (lVar8 - lVar10 == 0) {
      local_38 = local_38 + 2;
    }
    else {
      buffer_00[local_38 + 2] = '.';
      local_38 = local_38 + 3;
      iVar2 = NumericCastImpl<int,_long,_false>::Convert(lVar8 - lVar10);
      iVar3 = TimeToStringCast::FormatMicros(iVar2,buffer_00 + local_38);
      uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert(6 - iVar3);
      local_38 = uVar4 + local_38;
    }
  }
  return local_38;
}

Assistant:

static idx_t Format(interval_t interval, char buffer[]) {
		idx_t length = 0;
		if (interval.months != 0) {
			int32_t years = interval.months / 12;
			int32_t months = interval.months - years * 12;
			// format the years and months
			FormatIntervalValue(years, buffer, length, " year", 5);
			FormatIntervalValue(months, buffer, length, " month", 6);
		}
		if (interval.days != 0) {
			// format the days
			FormatIntervalValue(interval.days, buffer, length, " day", 4);
		}
		if (interval.micros != 0) {
			if (length != 0) {
				// space if there is already something in the buffer
				buffer[length++] = ' ';
			}
			int64_t micros = interval.micros;
			if (micros < 0) {
				// negative time: append negative sign
				buffer[length++] = '-';
			} else {
				micros = -micros;
			}
			int64_t hour = -(micros / Interval::MICROS_PER_HOUR);
			micros += hour * Interval::MICROS_PER_HOUR;
			int64_t min = -(micros / Interval::MICROS_PER_MINUTE);
			micros += min * Interval::MICROS_PER_MINUTE;
			int64_t sec = -(micros / Interval::MICROS_PER_SEC);
			micros += sec * Interval::MICROS_PER_SEC;
			micros = -micros;

			if (hour < 10) {
				buffer[length++] = '0';
			}
			FormatSignedNumber(hour, buffer, length);
			buffer[length++] = ':';
			FormatTwoDigits(min, buffer, length);
			buffer[length++] = ':';
			FormatTwoDigits(sec, buffer, length);
			if (micros != 0) {
				buffer[length++] = '.';
				auto trailing_zeros = TimeToStringCast::FormatMicros(NumericCast<int32_t>(micros), buffer + length);
				length += NumericCast<idx_t>(6 - trailing_zeros);
			}
		} else if (length == 0) {
			// empty interval: default to 00:00:00
			memcpy(buffer, "00:00:00", 8); // NOLINT
			return 8;
		}
		return length;
	}